

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLParam<int>::Print(CLParam<int> *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)(this + 0x30),*(long *)(this + 0x38));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# [Default = ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)(this + 0x54));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  PrintSimple(this);
  return;
}

Assistant:

void Print()
    {
        std::cout << "# " << description << std::endl ;
        std::cout << "# [Default = " << default_value << "]" << std::endl;
        PrintSimple() ;
    }